

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUSet-inl.hh
# Opt level: O0

bool __thiscall
phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
insert(LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,size_t size)

{
  bool bVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>,_bool>
  pVar2;
  tuple<unsigned_long> local_58;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_50;
  undefined1 local_30 [8];
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>,_bool>
  emplace_ret;
  size_t size_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  emplace_ret._8_8_ = size;
  ::std::make_tuple<std::__cxx11::string_const&>(&local_50,key);
  ::std::make_tuple<unsigned_long&>((unsigned_long *)&local_58);
  pVar2 = ::std::
          unordered_map<std::__cxx11::string,phosg::LRUSet<std::__cxx11::string>::Item,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUSet<std::__cxx11::string>::Item>>>
          ::
          emplace<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string>,std::tuple<unsigned_long>>
                    ((unordered_map<std::__cxx11::string,phosg::LRUSet<std::__cxx11::string>::Item,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,phosg::LRUSet<std::__cxx11::string>::Item>>>
                      *)&this->items,(piecewise_construct_t *)&::std::piecewise_construct,&local_50,
                     &local_58);
  local_30 = (undefined1  [8])
             pVar2.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
             ._M_cur;
  emplace_ret.first.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_true>
  ._M_cur._0_1_ = pVar2.second;
  ::std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~tuple(&local_50);
  bVar1 = after_emplace(this,(pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>,_false,_true>,_bool>
                              *)local_30,emplace_ret._8_8_);
  return bVar1;
}

Assistant:

bool LRUSet<K>::insert(const K& key, size_t size) {
  auto emplace_ret = this->items.emplace(std::piecewise_construct,
      std::make_tuple(key), std::make_tuple(size));
  return this->after_emplace(emplace_ret, size);
}